

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReorderFunctions.cpp
# Opt level: O2

void __thiscall wasm::ReorderFunctions::run(ReorderFunctions *this,Module *module)

{
  pointer puVar1;
  pointer puVar2;
  mapped_type *pmVar3;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range2;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar4;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *curr;
  pointer puVar5;
  WalkerPass<wasm::PostWalker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>_>
  local_178;
  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_70;
  undefined1 local_68 [8];
  NameCountMap counts;
  
  local_68 = (undefined1  [8])&counts._M_h._M_rehash_policy._M_next_resize;
  counts._M_h._M_buckets = (__buckets_ptr)0x1;
  counts._M_h._M_bucket_count = 0;
  counts._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  counts._M_h._M_element_count._0_4_ = 0x3f800000;
  counts._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  counts._M_h._M_rehash_policy._4_4_ = 0;
  counts._M_h._M_rehash_policy._M_next_resize = 0;
  puVar1 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = (module->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    std::__detail::
    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
    ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)local_68,
                 (key_type *)
                 (puVar4->_M_t).
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
  }
  local_178.super_Pass.name._M_dataplus._M_p = (pointer)&local_178.super_Pass.name.field_2;
  local_178.super_Pass.runner = (PassRunner *)0x0;
  local_178.super_Pass.name._M_string_length = 0;
  local_178.super_Pass.name.field_2._M_local_buf[0] = '\0';
  local_178.super_PostWalker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>.
  super_Walker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>.replacep =
       (Expression **)0x0;
  local_178.super_PostWalker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>.
  super_Walker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>.stack.usedFixed
       = 0;
  local_178.super_PostWalker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>.
  super_Walker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.super_PostWalker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>.
  super_Walker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.super_PostWalker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>.
  super_Walker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.super_PostWalker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>.
  super_Walker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>.currFunction =
       (Function *)0x0;
  local_178.super_PostWalker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>.
  super_Walker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>.currModule =
       (Module *)0x0;
  local_178.super_Pass._vptr_Pass = (_func_int **)&PTR__WalkerPass_00e20ae8;
  local_70 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              *)local_68;
  WalkerPass<wasm::PostWalker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>_>
  ::run(&local_178,(this->super_Pass).runner,module);
  WalkerPass<wasm::PostWalker<wasm::CallCountScanner,_wasm::Visitor<wasm::CallCountScanner,_void>_>_>
  ::~WalkerPass(&local_178);
  if ((module->start).super_IString.str._M_str != (char *)0x0) {
    pmVar3 = std::__detail::
             _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)local_68,&module->start);
    LOCK();
    (pmVar3->super___atomic_base<unsigned_int>)._M_i =
         (pmVar3->super___atomic_base<unsigned_int>)._M_i + 1;
    UNLOCK();
  }
  puVar2 = (module->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar5 = (module->exports).
                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar2; puVar5 = puVar5 + 1) {
    pmVar3 = std::__detail::
             _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)local_68,
                          &((puVar5->_M_t).
                            super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                            .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl)->value);
    LOCK();
    (pmVar3->super___atomic_base<unsigned_int>)._M_i =
         (pmVar3->super___atomic_base<unsigned_int>)._M_i + 1;
    UNLOCK();
  }
  ElementUtils::
  iterAllElementFunctionNames<wasm::ReorderFunctions::run(wasm::Module*)::_lambda(wasm::Name&)_1_>
            (module,(NameCountMap *)local_68);
  std::
  __sort<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>*,std::vector<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>,std::allocator<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<wasm::ReorderFunctions::run(wasm::Module*)::_lambda(std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>const&,std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>const&)_1_>>
            ((module->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (module->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_dcodeIO[P]binaryen_src_passes_ReorderFunctions_cpp:88:15)>
              )local_68);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_68);
  return;
}

Assistant:

void run(Module* module) override {
    NameCountMap counts;
    // fill in info, as we operate on it in parallel (each function to its own
    // entry)
    for (auto& func : module->functions) {
      counts[func->name];
    }
    // find counts on function calls
    CallCountScanner(&counts).run(getPassRunner(), module);
    // find counts on global usages
    if (module->start.is()) {
      counts[module->start]++;
    }
    for (auto& curr : module->exports) {
      counts[curr->value]++;
    }
    ElementUtils::iterAllElementFunctionNames(
      module, [&](Name& name) { counts[name]++; });
    // TODO: count all RefFunc as well
    // TODO: count the declaration section as well, which adds another mention
    // sort
    std::sort(module->functions.begin(),
              module->functions.end(),
              [&counts](const std::unique_ptr<Function>& a,
                        const std::unique_ptr<Function>& b) -> bool {
                if (counts[a->name] == counts[b->name]) {
                  return a->name > b->name;
                }
                return counts[a->name] > counts[b->name];
              });
  }